

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool ctemplate::Template::IsBlankOrOnlyHasOneRemovableMarker
               (char **line,size_t *len,MarkerDelimiters *delim)

{
  size_t __n;
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  char *clean_line;
  size_t local_40;
  size_t new_len;
  
  clean_line = *line;
  new_len = *len;
  StripTemplateWhiteSpace(&clean_line,&new_len);
  sVar6 = new_len;
  pcVar1 = clean_line;
  if (new_len == 0) {
    sVar6 = 0;
  }
  else {
    __n = delim->start_marker_len;
    local_40 = delim->end_marker_len;
    if ((((new_len < local_40 + __n + 1) ||
         (iVar3 = bcmp(clean_line,delim->start_marker,__n), iVar3 != 0)) ||
        (pvVar4 = memchr("#/>!%=",(int)pcVar1[__n],7), sVar2 = local_40, pvVar4 == (void *)0x0)) ||
       (pcVar5 = anon_unknown_14::memmatch(pcVar1 + __n,sVar6 - __n,delim->end_marker,local_40),
       pcVar5 + sVar2 != pcVar1 + sVar6 || pcVar5 == (char *)0x0)) {
      return false;
    }
  }
  *line = pcVar1;
  *len = sVar6;
  return true;
}

Assistant:

bool Template::IsBlankOrOnlyHasOneRemovableMarker(
    const char** line, size_t* len, const Template::MarkerDelimiters& delim) {
  const char *clean_line = *line;
  size_t new_len = *len;
  StripTemplateWhiteSpace(&clean_line, &new_len);

  // If there was only white space on the line, new_len will now be zero.
  // In that case the line should be removed, so return true.
  if (new_len == 0) {
    *line = clean_line;
    *len = new_len;
    return true;
  }

  // The smallest removable marker is at least start_marker_len +
  // end_marker_len + 1 characters long.  If there aren't enough
  // characters, then keep the line by returning false.
  if (new_len < delim.start_marker_len + delim.end_marker_len + 1) {
    return false;
  }

  // Only {{#...}}, {{/....}, {{>...}, {{!...}, {{%...}} and {{=...=}}
  // are "removable"
  if (memcmp(clean_line, delim.start_marker, delim.start_marker_len) != 0 ||
      !strchr("#/>!%=", clean_line[delim.start_marker_len])) {
    return false;
  }

  const char *found_end_marker = memmatch(clean_line + delim.start_marker_len,
                                          new_len - delim.start_marker_len,
                                          delim.end_marker,
                                          delim.end_marker_len);

  // Make sure the end marker comes at the end of the line.
  if (!found_end_marker ||
      found_end_marker + delim.end_marker_len != clean_line + new_len) {
    return false;
  }

  // else return the line stripped of its white space chars so when the
  // marker is removed in expansion, no white space is left from the line
  // that has now been removed
  *line = clean_line;
  *len = new_len;
  return true;
}